

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exact.cpp
# Opt level: O2

double __thiscall libDAI::Exact::run(Exact *this)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  TFactor<double> *Q;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Var *n;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VarSet *ns;
  undefined4 extraout_var_06;
  long lVar4;
  size_t I;
  ulong uVar5;
  double dVar6;
  Factor P;
  TFactor<double> TStack_f8;
  TFactor<double> local_c0;
  TFactor<double> local_88;
  VarSet local_50;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&TStack_f8,this);
    poVar2 = std::operator<<(poVar2,(string *)&TStack_f8);
    std::operator<<(poVar2,"...");
    std::__cxx11::string::~string((string *)&TStack_f8);
  }
  TFactor<double>::TFactor(&TStack_f8);
  uVar5 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))
                      ((long *)CONCAT44(extraout_var_00,iVar1));
    if (uVar3 <= uVar5) break;
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    Q = (TFactor<double> *)
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x50))
                  ((long *)CONCAT44(extraout_var_01,iVar1),uVar5);
    TFactor<double>::operator*=(&TStack_f8,Q);
    uVar5 = uVar5 + 1;
  }
  dVar6 = TProb<double>::totalSum(&TStack_f8._p);
  dVar6 = log(dVar6);
  *(double *)(this->_logZ)._M_value = dVar6;
  *(undefined8 *)((this->_logZ)._M_value + 8) = 0;
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x28))
                      ((long *)CONCAT44(extraout_var_02,iVar1));
    if (uVar3 <= uVar5) break;
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x30))
                         ((long *)CONCAT44(extraout_var_03,iVar1),uVar5);
    VarSet::VarSet(&local_50,n);
    TFactor<double>::partSum(&local_c0,&TStack_f8,&local_50);
    TFactor<double>::normalized(&local_88,&local_c0,NORMPROB);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_beliefsV).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),&local_88);
    TFactor<double>::~TFactor(&local_88);
    TFactor<double>::~TFactor(&local_c0);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_50);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x38;
  }
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x48))
                      ((long *)CONCAT44(extraout_var_04,iVar1));
    if (uVar3 <= uVar5) break;
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    ns = (VarSet *)
         (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x50))
                   ((long *)CONCAT44(extraout_var_05,iVar1),uVar5);
    TFactor<double>::partSum(&local_c0,&TStack_f8,ns);
    TFactor<double>::normalized(&local_88,&local_c0,NORMPROB);
    TFactor<double>::operator=
              ((TFactor<double> *)
               ((long)&(((this->_beliefsF).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),&local_88);
    TFactor<double>::~TFactor(&local_88);
    TFactor<double>::~TFactor(&local_c0);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x38;
  }
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (CONCAT44(extraout_var_06,iVar1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"finished");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  TFactor<double>::~TFactor(&TStack_f8);
  return 0.0;
}

Assistant:

double Exact::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";

        Factor P;
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            P *= grm().factor(I);

        double Z = P.totalSum();
        _logZ = std::log(Z);
        for( size_t i = 0; i < grm().nrVars(); i++ )
            _beliefsV[i] = P.partSum(grm().var(i)).normalized();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            _beliefsF[I] = P.partSum(grm().factor(I).vars()).normalized();

        if( Verbose() >= 1 )
            cout << "finished" << endl;

        return 0.0;
    }